

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexedBWT.h
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
bwtil::IndexedBWT::convertToTextCoordinates
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          IndexedBWT *this,pair<unsigned_long,_unsigned_long> interval)

{
  ulong uVar1;
  ulint local_30;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar1 = interval.first; (uVar1 & 0xffffffff) < interval.second;
      uVar1 = (ulong)((int)uVar1 + 1)) {
    local_30 = convertToTextCoordinate(this,uVar1 & 0xffffffff);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (__return_storage_ptr__,&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ulint> convertToTextCoordinates(pair<ulint, ulint> interval){

		vector<ulint> coord;
		for(uint i=interval.first;i<interval.second;i++)
			coord.push_back( convertToTextCoordinate(i) );

		return coord;

	}